

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O0

void __thiscall
AbstractTransaction_GetValueOut_Test::TestBody(AbstractTransaction_GetValueOut_Test *this)

{
  uint32_t sequence;
  uint32_t index;
  bool bVar1;
  char *pcVar2;
  Amount AVar3;
  AssertHelper local_468;
  Message local_460;
  string local_458;
  undefined1 local_438 [8];
  AssertionResult gtest_ar_4;
  Message local_420;
  Txid local_418;
  undefined1 local_3f8 [8];
  Txid txid;
  Message local_3d0;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar_3;
  Message local_3b0;
  string local_3a8;
  string local_388 [8];
  string hex;
  Message local_360;
  string local_358;
  undefined1 local_338 [8];
  AssertionResult gtest_ar_2;
  Message local_320;
  ByteData256 local_318;
  AssertHelper local_300;
  Message local_2f8;
  ScriptWitness local_2f0;
  allocator local_2c9;
  string local_2c8;
  undefined1 local_2a8 [8];
  ByteData bytedata2;
  Message local_288;
  string local_280;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_1;
  Message local_248;
  ByteData256 local_240;
  undefined1 local_228 [8];
  ByteData256 bytedata;
  Message local_208;
  int local_1fc;
  int64_t local_1f8;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar;
  Message local_1d8 [2];
  int64_t local_1c8;
  undefined1 local_1c0;
  int64_t local_1b8;
  undefined1 local_1b0;
  undefined1 local_1a8 [8];
  Amount amount;
  string local_190;
  Script local_170;
  int64_t local_138;
  undefined1 local_130;
  Amount local_128;
  allocator local_111;
  string local_110;
  Script local_f0;
  allocator local_a1;
  string local_a0;
  Txid local_80;
  undefined1 local_60 [8];
  Transaction tx;
  uint32_t seq;
  uint32_t vout;
  uint32_t locktime;
  int32_t version;
  AbstractTransaction_GetValueOut_Test *this_local;
  
  tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0xffffffff;
  cfd::core::Transaction::Transaction((Transaction *)local_60,2,3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a0,"e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6",
             &local_a1);
  cfd::core::Txid::Txid(&local_80,&local_a0);
  index = tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_;
  sequence = (uint32_t)
             tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_110,"76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac",&local_111);
  cfd::core::Script::Script(&local_f0,&local_110);
  cfd::core::Transaction::AddTxIn((Transaction *)local_60,&local_80,index,sequence,&local_f0);
  cfd::core::Script::~Script(&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  cfd::core::Txid::~Txid(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(10000);
  local_138 = AVar3.amount_;
  local_130 = AVar3.ignore_check_;
  local_128.amount_ = local_138;
  local_128.ignore_check_ = (bool)local_130;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_190,"0014913e0b9281dab16f502101ad4e655074396f34c5",
             (allocator *)&amount.field_0xf);
  cfd::core::Script::Script(&local_170,&local_190);
  cfd::core::Transaction::AddTxOut((Transaction *)local_60,&local_128,&local_170);
  cfd::core::Script::~Script(&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator((allocator<char> *)&amount.field_0xf);
  cfd::core::Amount::Amount((Amount *)local_1a8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      AVar3 = cfd::core::AbstractTransaction::GetValueOut((AbstractTransaction *)local_60);
      local_1c8 = AVar3.amount_;
      local_1c0 = AVar3.ignore_check_;
      local_1b8 = local_1c8;
      local_1b0 = local_1c0;
      local_1a8 = (undefined1  [8])local_1c8;
      amount.amount_._0_1_ = local_1c0;
    }
  }
  else {
    testing::Message::Message(local_1d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x109,
               "Expected: amount = tx.GetValueOut() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_1d8);
  }
  local_1f8 = cfd::core::Amount::GetSatoshiValue((Amount *)local_1a8);
  local_1fc = 10000;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((EqHelper<false> *)local_1f0,"amount.GetSatoshiValue()","10000",&local_1f8,&local_1fc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &bytedata.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x10a,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &bytedata.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_208);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &bytedata.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_228);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::AbstractTransaction::GetHash(&local_240,(AbstractTransaction *)local_60);
      cfd::core::ByteData256::operator=((ByteData256 *)local_228,&local_240);
      cfd::core::ByteData256::~ByteData256(&local_240);
    }
  }
  else {
    testing::Message::Message(&local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x10e,
               "Expected: bytedata = tx.GetHash() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_248);
  }
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_280,(ByteData256 *)local_228);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_260,"bytedata.GetHex().c_str()",
             "\"94807f961466e1e236d8192f9a073fb9dea46cad8434c568b55dec0a0f197b0f\"",pcVar2,
             "94807f961466e1e236d8192f9a073fb9dea46cad8434c568b55dec0a0f197b0f");
  std::__cxx11::string::~string((string *)&local_280);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    testing::Message::Message(&local_288);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &bytedata2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x111,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &bytedata2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_288);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &bytedata2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2c8,
             "02158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763",&local_2c9);
  cfd::core::ByteData::ByteData((ByteData *)local_2a8,&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::AddScriptWitnessStack
                (&local_2f0,(Transaction *)local_60,0,(ByteData *)local_2a8);
      cfd::core::ScriptWitness::~ScriptWitness(&local_2f0);
    }
  }
  else {
    testing::Message::Message(&local_2f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x116,
               "Expected: tx.AddScriptWitnessStack(0, bytedata2) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_300,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    testing::Message::~Message(&local_2f8);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::AbstractTransaction::GetWitnessHash(&local_318,(AbstractTransaction *)local_60);
      cfd::core::ByteData256::operator=((ByteData256 *)local_228,&local_318);
      cfd::core::ByteData256::~ByteData256(&local_318);
    }
  }
  else {
    testing::Message::Message(&local_320);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x117,
               "Expected: bytedata = tx.GetWitnessHash() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_320);
  }
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_358,(ByteData256 *)local_228);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_338,"bytedata.GetHex().c_str()",
             "\"0cc445f41d8b7af9d9f24b60516b1f4ce18d67595b1ca9143678a8df2a7b7416\"",pcVar2,
             "0cc445f41d8b7af9d9f24b60516b1f4ce18d67595b1ca9143678a8df2a7b7416");
  std::__cxx11::string::~string((string *)&local_358);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
  if (!bVar1) {
    testing::Message::Message(&local_360);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_338);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&hex.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x11a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)((long)&hex.field_2 + 8),&local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&hex.field_2 + 8));
    testing::Message::~Message(&local_360);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
  std::__cxx11::string::string(local_388);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_3a8,(AbstractTransaction *)local_60);
      std::__cxx11::string::operator=(local_388,(string *)&local_3a8);
      std::__cxx11::string::~string((string *)&local_3a8);
    }
  }
  else {
    testing::Message::Message(&local_3b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x11e,
               "Expected: hex = tx.GetHex() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_3b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_3b0);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_3c8,"hex.c_str()",
             "\"02000000000101b690010c9f7fea1c2ec617a8513dec56a8bd294e2fb671f67af487671f1ef7e9000000001976a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88acffffffff011027000000000000160014913e0b9281dab16f502101ad4e655074396f34c5012102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d8278076303000000\""
             ,pcVar2,
             "02000000000101b690010c9f7fea1c2ec617a8513dec56a8bd294e2fb671f67af487671f1ef7e9000000001976a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88acffffffff011027000000000000160014913e0b9281dab16f502101ad4e655074396f34c5012102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d8278076303000000"
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
  if (!bVar1) {
    testing::Message::Message(&local_3d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x121,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_3d0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_3d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
  cfd::core::Txid::Txid((Txid *)local_3f8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::AbstractTransaction::GetTxid(&local_418,(AbstractTransaction *)local_60);
      cfd::core::Txid::operator=((Txid *)local_3f8,&local_418);
      cfd::core::Txid::~Txid(&local_418);
    }
  }
  else {
    testing::Message::Message(&local_420);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x125,
               "Expected: txid = tx.GetTxid() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_420);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_420);
  }
  cfd::core::Txid::GetHex_abi_cxx11_(&local_458,(Txid *)local_3f8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_438,"txid.GetHex().c_str()",
             "\"0f7b190f0aec5db568c53484ad6ca4deb93f079a2f19d836e2e16614967f8094\"",pcVar2,
             "0f7b190f0aec5db568c53484ad6ca4deb93f079a2f19d836e2e16614967f8094");
  std::__cxx11::string::~string((string *)&local_458);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
  if (!bVar1) {
    testing::Message::Message(&local_460);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_438);
    testing::internal::AssertHelper::AssertHelper
              (&local_468,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x128,pcVar2);
    testing::internal::AssertHelper::operator=(&local_468,&local_460);
    testing::internal::AssertHelper::~AssertHelper(&local_468);
    testing::Message::~Message(&local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
  cfd::core::Txid::~Txid((Txid *)local_3f8);
  std::__cxx11::string::~string(local_388);
  cfd::core::ByteData::~ByteData((ByteData *)local_2a8);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_228);
  cfd::core::Transaction::~Transaction((Transaction *)local_60);
  return;
}

Assistant:

TEST(AbstractTransaction, GetValueOut) {
  int32_t version = 2;
  uint32_t locktime = 3;
  uint32_t vout = 0;
  uint32_t seq = 0xffffffff;

  Transaction tx(version, locktime);
  tx.AddTxIn(
      Txid("e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6"),
      vout, seq, Script("76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac"));
  tx.AddTxOut(Amount::CreateBySatoshiAmount(10000),
              Script("0014913e0b9281dab16f502101ad4e655074396f34c5"));
  Amount amount;
  // GetValueOut
  EXPECT_NO_THROW(amount = tx.GetValueOut());
  EXPECT_EQ(amount.GetSatoshiValue(), 10000);

  // GetHash(bool)
  ByteData256 bytedata;
  EXPECT_NO_THROW(bytedata = tx.GetHash());
  EXPECT_STREQ(
      bytedata.GetHex().c_str(),
      "94807f961466e1e236d8192f9a073fb9dea46cad8434c568b55dec0a0f197b0f");

  // GetWitnessHash
  ByteData bytedata2(
      "02158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763");
  EXPECT_NO_THROW(tx.AddScriptWitnessStack(0, bytedata2));
  EXPECT_NO_THROW(bytedata = tx.GetWitnessHash());
  EXPECT_STREQ(
      bytedata.GetHex().c_str(),
      "0cc445f41d8b7af9d9f24b60516b1f4ce18d67595b1ca9143678a8df2a7b7416");

  // GetHex
  std::string hex;
  EXPECT_NO_THROW(hex = tx.GetHex());
  EXPECT_STREQ(
      hex.c_str(),
      "02000000000101b690010c9f7fea1c2ec617a8513dec56a8bd294e2fb671f67af487671f1ef7e9000000001976a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88acffffffff011027000000000000160014913e0b9281dab16f502101ad4e655074396f34c5012102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d8278076303000000");

  // GetTxid
  Txid txid;
  EXPECT_NO_THROW(txid = tx.GetTxid());
  EXPECT_STREQ(
      txid.GetHex().c_str(),
      "0f7b190f0aec5db568c53484ad6ca4deb93f079a2f19d836e2e16614967f8094");
}